

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O2

cmCommand * __thiscall
cmCTestSetDirectoryPropertiesCommand::Clone(cmCTestSetDirectoryPropertiesCommand *this)

{
  cmCommand *pcVar1;
  
  pcVar1 = (cmCommand *)operator_new(0x38);
  pcVar1->Makefile = (cmMakefile *)0x0;
  (pcVar1->Error)._M_dataplus._M_p = (pointer)&(pcVar1->Error).field_2;
  (pcVar1->Error)._M_string_length = 0;
  (pcVar1->Error).field_2._M_local_buf[0] = '\0';
  pcVar1->_vptr_cmCommand = (_func_int **)&PTR__cmCommand_005e0fd0;
  pcVar1[1]._vptr_cmCommand = (_func_int **)this->TestHandler;
  return pcVar1;
}

Assistant:

cmCommand* Clone() override
  {
    cmCTestSetDirectoryPropertiesCommand* c =
      new cmCTestSetDirectoryPropertiesCommand;
    c->TestHandler = this->TestHandler;
    return c;
  }